

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filterednormalizer2.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::FilteredNormalizer2::normalizeSecondAndAppend
          (FilteredNormalizer2 *this,UnicodeString *first,UnicodeString *second,UBool doNormalize,
          UErrorCode *errorCode)

{
  short sVar1;
  int32_t len;
  int32_t srcStart;
  undefined4 extraout_var;
  UnicodeString *pUVar2;
  int iVar3;
  UnicodeString prefix;
  UnicodeString middle;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((((undefined1  [56])((undefined1  [56])first->fUnion & (undefined1  [56])0x1) ==
          (undefined1  [56])0x0) &&
        ((undefined1  [56])((undefined1  [56])second->fUnion & (undefined1  [56])0x1) ==
         (undefined1  [56])0x0)) && (first != second)) {
      if ((ushort)(first->fUnion).fStackFields.fLengthAndFlags < 0x20) {
        if (doNormalize != '\0') {
          iVar3 = (*(this->super_Normalizer2).super_UObject._vptr_UObject[3])
                            (this,second,first,errorCode);
          return (UnicodeString *)CONCAT44(extraout_var,iVar3);
        }
        pUVar2 = UnicodeString::operator=(first,second);
        return pUVar2;
      }
      len = UnicodeSet::span(this->set,second,0,USET_SPAN_SIMPLE);
      if (len != 0) {
        UnicodeString::tempSubString(&prefix,second,0,len);
        srcStart = UnicodeSet::spanBack(this->set,first,0x7fffffff,USET_SPAN_SIMPLE);
        if (srcStart == 0) {
          (*(this->norm2->super_UObject)._vptr_UObject[(ulong)(doNormalize == '\0') + 5])
                    (this->norm2,first,&prefix,errorCode);
        }
        else {
          UnicodeString::UnicodeString(&middle,first,srcStart,0x7fffffff);
          (*(this->norm2->super_UObject)._vptr_UObject[(ulong)(doNormalize == '\0') + 5])
                    (this->norm2,&middle,&prefix,errorCode);
          UnicodeString::replace(first,srcStart,0x7fffffff,&middle);
          UnicodeString::~UnicodeString(&middle);
        }
        UnicodeString::~UnicodeString(&prefix);
      }
      sVar1 = (second->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar3 = (second->fUnion).fFields.fLength;
      }
      else {
        iVar3 = (int)sVar1 >> 5;
      }
      if (len < iVar3) {
        UnicodeString::tempSubString(&prefix,second,len,0x7fffffff);
        if (doNormalize == '\0') {
          UnicodeString::append(first,&prefix);
        }
        else {
          normalize(this,&prefix,first,USET_SPAN_NOT_CONTAINED,errorCode);
        }
        UnicodeString::~UnicodeString(&prefix);
      }
    }
    else {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return first;
}

Assistant:

UnicodeString &
FilteredNormalizer2::normalizeSecondAndAppend(UnicodeString &first,
                                              const UnicodeString &second,
                                              UBool doNormalize,
                                              UErrorCode &errorCode) const {
    uprv_checkCanGetBuffer(first, errorCode);
    uprv_checkCanGetBuffer(second, errorCode);
    if(U_FAILURE(errorCode)) {
        return first;
    }
    if(&first==&second) {
        errorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return first;
    }
    if(first.isEmpty()) {
        if(doNormalize) {
            return normalize(second, first, errorCode);
        } else {
            return first=second;
        }
    }
    // merge the in-filter suffix of the first string with the in-filter prefix of the second
    int32_t prefixLimit=set.span(second, 0, USET_SPAN_SIMPLE);
    if(prefixLimit!=0) {
        UnicodeString prefix(second.tempSubString(0, prefixLimit));
        int32_t suffixStart=set.spanBack(first, INT32_MAX, USET_SPAN_SIMPLE);
        if(suffixStart==0) {
            if(doNormalize) {
                norm2.normalizeSecondAndAppend(first, prefix, errorCode);
            } else {
                norm2.append(first, prefix, errorCode);
            }
        } else {
            UnicodeString middle(first, suffixStart, INT32_MAX);
            if(doNormalize) {
                norm2.normalizeSecondAndAppend(middle, prefix, errorCode);
            } else {
                norm2.append(middle, prefix, errorCode);
            }
            first.replace(suffixStart, INT32_MAX, middle);
        }
    }
    if(prefixLimit<second.length()) {
        UnicodeString rest(second.tempSubString(prefixLimit, INT32_MAX));
        if(doNormalize) {
            normalize(rest, first, USET_SPAN_NOT_CONTAINED, errorCode);
        } else {
            first.append(rest);
        }
    }
    return first;
}